

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void arrayminmax(double *x,int N,double *amin,double *amax)

{
  double local_40;
  double local_38;
  int local_2c;
  int i;
  double *amax_local;
  double *amin_local;
  int N_local;
  double *x_local;
  
  *amax = -1.79769313486232e+308;
  *amin = 1.79769313486232e+308;
  for (local_2c = 0; local_2c < N; local_2c = local_2c + 1) {
    if (x[local_2c] < *amax || x[local_2c] == *amax) {
      local_38 = *amax;
    }
    else {
      local_38 = x[local_2c];
    }
    *amax = local_38;
    if (*amin <= x[local_2c]) {
      local_40 = *amin;
    }
    else {
      local_40 = x[local_2c];
    }
    *amin = local_40;
  }
  return;
}

Assistant:

void arrayminmax(double *x, int N, double *amin,double *amax) {
	int i;
	*amax = - DBL_MAX;
	*amin = DBL_MAX;

	for(i = 0; i < N;++i) {
		*amax = x[i] > *amax ? x[i] : *amax;
		*amin = x[i] < *amin ? x[i] : *amin;
	}

}